

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  PatternGeneration *pattern_generation_00;
  string *scripts_dir_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 local_2840 [8];
  mt19937 mt;
  random_device rd;
  string output_dir;
  path textures_path;
  path scripts_path;
  string type;
  string media_dir;
  string scripts_dir;
  PatternGeneration pattern_generation;
  undefined1 local_60 [8];
  string textures_dir;
  uint textures;
  uint start;
  uint resolution;
  
  textures_dir.field_2._8_4_ = 0;
  textures_dir.field_2._12_4_ = 0;
  textures = 0;
  scripts_path.m_pathname.field_2._8_8_ = &type._M_string_length;
  type._M_dataplus._M_p = (pointer)0x0;
  type.field_2._8_8_ = &media_dir._M_string_length;
  media_dir._M_dataplus._M_p = (pointer)0x0;
  type._M_string_length._0_1_ = 0;
  media_dir._M_string_length._0_1_ = 0;
  rd.field_0._M_mt._M_p = (size_t)&output_dir._M_string_length;
  output_dir._M_dataplus._M_p = (pointer)0x0;
  output_dir._M_string_length._0_1_ = 0;
  parseArgs(argc,argv,(uint *)(textures_dir.field_2._M_local_buf + 8),
            (uint *)(textures_dir.field_2._M_local_buf + 0xc),(string *)((long)&type.field_2 + 8),
            &textures,(string *)((long)&scripts_path.m_pathname.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&type.field_2 + 8),"textures/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&media_dir.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&type.field_2 + 8),"scripts/");
  std::__cxx11::string::string((string *)(output_dir.field_2._M_local_buf + 8),(string *)local_60);
  bVar2 = boost::filesystem::create_directories((path *)((long)&output_dir.field_2 + 8));
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Created ");
    poVar4 = std::operator<<(poVar4,(string *)local_60);
    poVar4 = std::operator<<(poVar4," folder");
    std::operator<<(poVar4,"\n");
  }
  std::__cxx11::string::string
            ((string *)(textures_path.m_pathname.field_2._M_local_buf + 8),
             (string *)(media_dir.field_2._M_local_buf + 8));
  bVar2 = boost::filesystem::create_directories
                    ((path *)((long)&textures_path.m_pathname.field_2 + 8));
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Created ");
    poVar4 = std::operator<<(poVar4,(string *)(media_dir.field_2._M_local_buf + 8));
    poVar4 = std::operator<<(poVar4," folder");
    std::operator<<(poVar4,"\n");
  }
  std::random_device::random_device((random_device *)&mt._M_p);
  uVar3 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)local_2840,(ulong)uVar3);
  PatternGeneration::PatternGeneration((PatternGeneration *)(scripts_dir.field_2._M_local_buf + 8));
  uVar5 = (ulong)(uint)textures_dir.field_2._12_4_;
  uVar6 = (ulong)(uint)textures_dir.field_2._8_4_;
  pattern_generation_00 = (PatternGeneration *)(scripts_dir.field_2._M_local_buf + 8);
  scripts_dir_00 = (string *)(&media_dir.field_2._M_allocated_capacity + 1);
  do {
    while( true ) {
      start = (uint)uVar5;
      if (uVar6 <= uVar5) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pattern_generation);
        std::random_device::~random_device((random_device *)&mt._M_p);
        std::__cxx11::string::~string((string *)(textures_path.m_pathname.field_2._M_local_buf + 8))
        ;
        std::__cxx11::string::~string((string *)(output_dir.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(media_dir.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_60);
        std::__cxx11::string::~string((string *)((long)&rd.field_0 + 0x1380));
        std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(scripts_path.m_pathname.field_2._M_local_buf + 8));
        return 0;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"\rGenerating ");
      uVar5 = uVar5 + 1;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," of ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ostream::flush();
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&scripts_path.m_pathname.field_2 + 8);
      bVar2 = std::operator==(pbVar1,"all");
      if (!bVar2) break;
      generateFlatTexture(pattern_generation_00,&textures,&start,(string *)local_60,scripts_dir_00);
      generateChessTexture(pattern_generation_00,&textures,&start,(string *)local_60,scripts_dir_00)
      ;
      generateGradientTexture
                (pattern_generation_00,&textures,&start,(string *)local_60,scripts_dir_00);
LAB_0010499e:
      generatePerlinTexture
                (pattern_generation_00,&textures,&start,(string *)local_60,scripts_dir_00);
    }
    bVar2 = std::operator==(pbVar1,"perlin");
    if (bVar2) goto LAB_0010499e;
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (&scripts_path.m_pathname.field_2._M_allocated_capacity + 1);
    bVar2 = std::operator==(pbVar1,"gradient");
    if (bVar2) {
      generateGradientTexture
                (pattern_generation_00,&textures,&start,(string *)local_60,scripts_dir_00);
    }
    else {
      bVar2 = std::operator==(pbVar1,"flat");
      if (bVar2) {
        generateFlatTexture(pattern_generation_00,&textures,&start,(string *)local_60,scripts_dir_00
                           );
      }
      else {
        bVar2 = std::operator==(pbVar1,"chess");
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"No valid option selected! Exiting...");
          std::endl<char,std::char_traits<char>>(poVar4);
          exit(1);
        }
        generateChessTexture
                  (pattern_generation_00,&textures,&start,(string *)local_60,scripts_dir_00);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    // Command-line arguments
    unsigned int textures {0};
    unsigned int start {0};
    unsigned int resolution {0};
    std::string type;
    std::string media_dir;
    std::string output_dir;

    /* root directory */
    parseArgs(argc, argv, textures, start, media_dir, resolution, type);
    std::string textures_dir=media_dir+"textures/";
    std::string scripts_dir=media_dir+"scripts/";

    boost::filesystem::path textures_path(textures_dir);
    if (boost::filesystem::create_directories(textures_path)) {
        std::cout << "Created " << textures_dir << " folder"<< "\n";
    }

    boost::filesystem::path scripts_path(scripts_dir);
    if (boost::filesystem::create_directories(scripts_path)) {
        std::cout << "Created " << scripts_dir << " folder"<< "\n";
    }

    /* Initialize random device */
    std::random_device rd;
    std::mt19937 mt(rd());
    std::uniform_int_distribution<int> dist;

    /* Pattern generator object instance */
    PatternGeneration pattern_generation;

    for (unsigned int i = start; i < textures; ++i)
    {
        std::cout << "\rGenerating " << i + 1 << " of " << textures << std::flush;

        if (type=="all")
        {
            /* Generate flat texture */
            generateFlatTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
            /* Generate chess texture */
            generateChessTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
            /* Generate gradient texture */
            generateGradientTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
            /* Generate perlin noise texture */
            generatePerlinTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="perlin")
        {
            /* Generate perlin noise texture */
            generatePerlinTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="gradient")
        {
            /* Generate gradient texture */
            generateGradientTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="flat")
        {
            /* Generate flat texture */
            generateFlatTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else if (type=="chess")
        {
            /* Generate chess texture */
            generateChessTexture(pattern_generation, resolution, i, textures_dir, scripts_dir);
        }
        else
        {
            std::cerr << "No valid option selected! Exiting..." << std::endl;
            exit(EXIT_FAILURE);
        }
    }
    return 0;
}